

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O0

Opnd * __thiscall
GlobOpt::ReplaceWConst<int>(GlobOpt *this,Instr **pInstr,int value,Value **pDstVal)

{
  StackSym *this_00;
  bool bVar1;
  uint sourceContextId;
  uint functionId;
  Opnd *pOVar2;
  RegOpnd *pRVar3;
  Value *pVVar4;
  StackSym *dstSym;
  Opnd *dst;
  Opnd *constOpnd;
  Instr **instr;
  Value **pDstVal_local;
  int value_local;
  Instr **pInstr_local;
  GlobOpt *this_local;
  
  pOVar2 = CreateIntConstOpnd(*pInstr,value);
  IR::Instr::ReplaceSrc1(*pInstr,pOVar2);
  IR::Instr::FreeSrc2(*pInstr);
  OptSrc(this,pOVar2,pInstr,(Value **)0x0,(IndirOpnd *)0x0);
  pOVar2 = IR::Instr::GetDst(*pInstr);
  pRVar3 = IR::Opnd::AsRegOpnd(pOVar2);
  this_00 = pRVar3->m_sym;
  bVar1 = StackSym::IsSingleDef(this_00);
  if (bVar1) {
    SetIsConstFlag(this_00,value);
  }
  sourceContextId = Func::GetSourceContextId(this->func);
  functionId = Func::GetLocalFunctionId(this->func);
  bVar1 = Js::Phases::IsEnabled((Phases *)&DAT_01ec1678,GlobOptPhase,sourceContextId,functionId);
  if (bVar1) {
    Output::Print(L"TRACE ");
    bVar1 = IsLoopPrePass(this);
    if (bVar1) {
      Output::Print(L"[%d, %d]",(ulong)(this->rootLoopPrePass->loopNumber - 1),
                    (ulong)(this->prePassLoop->loopNumber - 1));
    }
    Output::Print(L": ");
    Output::Print(L"Constant folding to %d: \n",(ulong)(uint)value);
    IR::Instr::Dump(*pInstr);
    Output::Flush();
  }
  pVVar4 = GetIntConstantValue(this,value,*pInstr,pOVar2);
  *pDstVal = pVVar4;
  return pOVar2;
}

Assistant:

IR::Opnd* GlobOpt::ReplaceWConst(IR::Instr **pInstr, T value, Value **pDstVal)
{
    IR::Instr * &instr = *pInstr;
    IR::Opnd * constOpnd = CreateIntConstOpnd(instr, value);

    instr->ReplaceSrc1(constOpnd);
    instr->FreeSrc2();

    this->OptSrc(constOpnd, &instr);

    IR::Opnd *dst = instr->GetDst();
    StackSym *dstSym = dst->AsRegOpnd()->m_sym;
    if (dstSym->IsSingleDef())
    {
        SetIsConstFlag(dstSym, value);
    }

    GOPT_TRACE_INSTR(instr, _u("Constant folding to %d: \n"), value);
    *pDstVal = GetIntConstantValue(value, instr, dst);
    return dst;
}